

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_mesh.cxx
# Opt level: O2

void __thiscall level_mesh::setup_collision_models(level_mesh *this,b_submesh_vec *submeshes)

{
  MeshInterface *this_00;
  uint uVar1;
  pointer ppbVar2;
  b_submesh *pbVar3;
  ulong uVar4;
  pointer pbVar5;
  undefined8 uVar6;
  bool bVar7;
  pointer tris;
  pointer ppbVar8;
  OPCODECREATE opcc;
  
  ppbVar8 = (submeshes->super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppbVar2 = (submeshes->super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  do {
    if (ppbVar8 == ppbVar2) {
      std::
      __sort<__gnu_cxx::__normal_iterator<b_submesh**,std::vector<b_submesh*,std::allocator<b_submesh*>>>,__gnu_cxx::__ops::_Iter_comp_iter<x1_pred>>
                ((submeshes->super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>)._M_impl.
                 super__Vector_impl_data._M_start,
                 (submeshes->super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>)._M_impl.
                 super__Vector_impl_data._M_finish);
      return;
    }
    pbVar3 = *ppbVar8;
    if ((pbVar3->opc_mesh).mTris == (IndexedTriangle *)0x0) {
      this_00 = &pbVar3->opc_mesh;
      uVar4 = (pbVar3->super_b_model_instance).num_faces;
      if (uVar4 < 2) {
        uVar1 = (pbVar3->super_b_model_instance).min_face;
        pbVar5 = (this->super_xr_mesh_builder).m_faces.
                 super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        tris = (pointer)pbVar3->opc_hack;
        *(undefined8 *)pbVar3->opc_hack[0].mVRef = *(undefined8 *)&pbVar5[uVar1].field_0;
        pbVar3->opc_hack[0].mVRef[2] = pbVar5[uVar1].field_0.field_0.v[2];
        uVar6 = *(undefined8 *)&pbVar5[uVar1].field_0;
        pbVar3->opc_hack[1].mVRef[2] = pbVar5[uVar1].field_0.field_0.v[2];
        *(undefined8 *)pbVar3->opc_hack[1].mVRef = uVar6;
        (pbVar3->opc_mesh).mNbTris = 2;
        Opcode::MeshInterface::SetStrides(this_00,0xc,0xc);
      }
      else {
        (pbVar3->opc_mesh).mNbTris = (udword)uVar4;
        Opcode::MeshInterface::SetStrides(this_00,0x40,0xc);
        tris = (this->super_xr_mesh_builder).m_faces.
               super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
               ._M_impl.super__Vector_impl_data._M_start + (pbVar3->super_b_model_instance).min_face
        ;
      }
      Opcode::MeshInterface::SetPointers
                (this_00,(IndexedTriangle *)tris,
                 (Point *)(this->m_fat_points).
                          super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
      (pbVar3->opc_mesh).mNbVerts =
           (udword)(((long)(this->super_xr_mesh_builder).super_xr_mesh.m_points.
                           super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->super_xr_mesh_builder).super_xr_mesh.m_points.
                          super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0xc);
      Opcode::OPCODECREATE::OPCODECREATE(&opcc);
      opcc.mIMesh = this_00;
      bVar7 = Opcode::Model::Build(&pbVar3->opc_model,&opcc);
      if (!bVar7) {
        __assert_fail("status",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_mesh.cxx"
                      ,0x15c,"void level_mesh::setup_collision_models(b_submesh_vec &) const");
      }
    }
    ppbVar8 = ppbVar8 + 1;
  } while( true );
}

Assistant:

void level_mesh::setup_collision_models(b_submesh_vec& submeshes) const
{
	for (b_submesh_vec_it it = submeshes.begin(), end = submeshes.end(); it != end; ++it) {
		b_submesh* sm = *it;
		if (sm->opc_mesh.GetTris() != null)
			continue;
		if (sm->num_faces > 1) {
			sm->opc_mesh.SetNbTriangles(udword(sm->num_faces & UINT32_MAX));
			sm->opc_mesh.SetStrides(sizeof(b_face), sizeof(fvector3));
			sm->opc_mesh.SetPointers((IndexedTriangle*)&m_faces[sm->min_face],
					(Point*)&m_fat_points[0]);
		} else {
			// FIXME: hack to handle 1-face meshes
			sm->opc_hack[1] = sm->opc_hack[0] = *(IndexedTriangle*)m_faces[sm->min_face].v;
			sm->opc_mesh.SetNbTriangles(2);
			sm->opc_mesh.SetStrides(sizeof(IndexedTriangle), sizeof(fvector3));
			sm->opc_mesh.SetPointers(sm->opc_hack, (Point*)&m_fat_points[0]);
		}
		sm->opc_mesh.SetNbVertices(udword(m_points.size() & UINT32_MAX));
		OPCODECREATE opcc;
		opcc.mIMesh = &sm->opc_mesh;
		BOOL status = sm->opc_model.Build(opcc);
		xr_assert(status);
	}
	std::sort(submeshes.begin(), submeshes.end(), x1_pred());
}